

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-move.c
# Opt level: O2

_Bool monster_can_kill(monster *mon,loc_conflict grid)

{
  _Bool _Var1;
  wchar_t wVar2;
  monster *mon_00;
  
  mon_00 = square_monster(cave,(loc)grid);
  _Var1 = true;
  if (mon_00 != (monster *)0x0) {
    _Var1 = monster_is_unique(mon_00);
    if (((!_Var1) &&
        (_Var1 = flag_has_dbg(mon->race->flags,0xb,0x32,"mon->race->flags","RF_KILL_BODY"), _Var1))
       && (wVar2 = compare_monsters(mon,mon_00), L'\0' < wVar2)) {
      return true;
    }
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool monster_can_kill(struct monster *mon, struct loc grid)
{
	struct monster *mon1 = square_monster(cave, grid);

	/* No monster */
	if (!mon1) return true;

	/* No trampling uniques */
	if (monster_is_unique(mon1)) {
		return false;
	}

	if (rf_has(mon->race->flags, RF_KILL_BODY) &&
		compare_monsters(mon, mon1) > 0) {
		return true;
	}

	return false;
}